

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O2

void Qentem::Test::TestRawVariableUTag4(QTest *test)

{
  StringStream<char16_t> *pSVar1;
  StringStream<char16_t> ss;
  Value<char16_t> value;
  StringStream<char16_t> local_58;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_48;
  undefined1 local_38;
  
  local_58.storage_ = (char16_t *)0x0;
  local_58.length_ = 0;
  local_58.capacity_ = 0;
  local_48.array_.storage_ = (Value<char16_t> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 0;
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L">");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"&");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\"");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\'");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<>");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<&");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<&");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L">\"");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\"\'");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<\">");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<\'>");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<&>");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"&\"&");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\"\'\"");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\'<\'");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\'&\'");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<>&\'\"");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\'\"<>&");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<\"&\'>");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<<<<<");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L">>>>>");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"&&&&&");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\"\"\"\"\"");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\'\'\'\'\'");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A<");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A>");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A&");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A\"");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A\'");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L">A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"&A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\"A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\'A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A<A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A>A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A&A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A\"A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A\'A");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA<AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA>AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA&AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA\"AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA\'AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA<<<<AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA>>>>AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA&&&&AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA\"\"\"\"AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AA\'\'\'\'AA");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"<A>B\'C\"D&E\'F\"G<H>I&G\"K");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"AB\"CD\'EF<GH>IGK\'");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"\"ABC\'DEF<GHI>GK<");
  Value<char16_t>::operator+=((Value<char16_t> *)&local_48.array_,L"A\"\"BC<<DE>>FG\'\'HI&&GK");
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:0}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x11d5e2,0x648);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:1}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x11d582,0x64b);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:2}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x11d59a,0x64e);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:3}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x11d606,0x651);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:4}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,pSVar1,(char16_t (*) [2])0x11e206,0x654);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:5}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"<>",0x657);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:6}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"<&",0x65a);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:7}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"<&",0x65d);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:8}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L">\"",0x660);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:9}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"\"\'",0x663);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:10}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"<\">",0x666);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:11}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"<\'>",0x669);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:12}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"<&>",0x66c);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:13}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"&\"&",0x66f);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:14}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"\"\'\"",0x672);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:15}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"\'<\'",0x675);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:16}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"\'&\'",0x678);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:17}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"<>&\'\"",0x67b);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:18}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"\'\"<>&",0x67e);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:19}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"<\"&\'>",0x681);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:20}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"<<<<<",0x684);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:21}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L">>>>>",0x687);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:22}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"&&&&&",0x68a);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:23}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"\"\"\"\"\"",0x68d);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:24}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"\'\'\'\'\'",0x690);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:25}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A<",0x693);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:26}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A>",0x696);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:27}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A&",0x699);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:28}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A\"",0x69c);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:29}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])L"A\'",0x69f);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:30}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x11d636,0x6a2);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:31}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x11d63e,0x6a5);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:32}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x11d646,0x6a8);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:33}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x11d64e,0x6ab);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:34}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,pSVar1,(char16_t (*) [3])0x11d656,0x6ae);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:35}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A<A",0x6b1);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:36}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A>A",0x6b4);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:37}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A&A",0x6b7);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:38}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A\"A",0x6ba);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:39}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,pSVar1,(char16_t (*) [4])L"A\'A",0x6bd);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:40}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA<AA",0x6c0);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:41}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA>AA",0x6c3);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:42}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA&AA",0x6c6);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:43}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA\"AA",0x6c9);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:44}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,pSVar1,(char16_t (*) [6])L"AA\'AA",0x6cc);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:45}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA<<<<AA",0x6cf);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:46}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA>>>>AA",0x6d2);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:47}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA&&&&AA",0x6d5);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:48}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA\"\"\"\"AA",0x6d8);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:49}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (test,pSVar1,(char16_t (*) [9])L"AA\'\'\'\'AA",0x6db);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:50}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[23]>
            (test,pSVar1,(char16_t (*) [23])L"<A>B\'C\"D&E\'F\"G<H>I&G\"K",0x6de);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:51}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[17]>
            (test,pSVar1,(char16_t (*) [17])L"AB\"CD\'EF<GH>IGK\'",0x6e1);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:52}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[17]>
            (test,pSVar1,(char16_t (*) [17])L"\"ABC\'DEF<GHI>GK<",0x6e4);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"{raw:53}",(Value<char16_t> *)&local_48.array_,&local_58);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[22]>
            (test,pSVar1,(char16_t (*) [22])L"A\"\"BC<<DE>>FG\'\'HI&&GK",0x6e7);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_48.array_);
  Memory::Deallocate(local_58.storage_);
  return;
}

Assistant:

static void TestRawVariableUTag4(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;

    value += uR"(<)";
    value += uR"(>)";
    value += uR"(&)";
    value += uR"(")";
    value += uR"(')";
    value += uR"(<>)";
    value += uR"(<&)";
    value += uR"(<&)";
    value += uR"(>")";
    value += uR"("')";
    value += uR"(<">)";
    value += uR"(<'>)";
    value += uR"(<&>)";
    value += uR"(&"&)";
    value += uR"("'")";
    value += uR"('<')";
    value += uR"('&')";
    value += uR"(<>&'")";
    value += uR"('"<>&)";
    value += uR"(<"&'>)";

    value += uR"(<<<<<)";
    value += uR"(>>>>>)";
    value += uR"(&&&&&)";
    value += uR"(""""")";
    value += uR"(''''')";

    value += uR"(A<)";
    value += uR"(A>)";
    value += uR"(A&)";
    value += uR"(A")";
    value += uR"(A')";
    value += uR"(<A)";
    value += uR"(>A)";
    value += uR"(&A)";
    value += uR"("A)";
    value += uR"('A)";
    value += uR"(A<A)";
    value += uR"(A>A)";
    value += uR"(A&A)";
    value += uR"(A"A)";
    value += uR"(A'A)";

    value += uR"(AA<AA)";
    value += uR"(AA>AA)";
    value += uR"(AA&AA)";
    value += uR"(AA"AA)";
    value += uR"(AA'AA)";

    value += uR"(AA<<<<AA)";
    value += uR"(AA>>>>AA)";
    value += uR"(AA&&&&AA)";
    value += uR"(AA""""AA)";
    value += uR"(AA''''AA)";

    value += uR"(<A>B'C"D&E'F"G<H>I&G"K)";
    value += uR"(AB"CD'EF<GH>IGK')";
    value += uR"("ABC'DEF<GHI>GK<)";
    value += uR"(A""BC<<DE>>FG''HI&&GK)";

    test.IsEqual(Template::Render(uR"({raw:0})", value, ss), uR"(<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:1})", value, ss), uR"(>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:2})", value, ss), uR"(&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:3})", value, ss), uR"(")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:4})", value, ss), uR"(')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:5})", value, ss), uR"(<>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:6})", value, ss), uR"(<&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:7})", value, ss), uR"(<&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:8})", value, ss), uR"(>")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:9})", value, ss), uR"("')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:10})", value, ss), uR"(<">)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:11})", value, ss), uR"(<'>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:12})", value, ss), uR"(<&>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:13})", value, ss), uR"(&"&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:14})", value, ss), uR"("'")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:15})", value, ss), uR"('<')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:16})", value, ss), uR"('&')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:17})", value, ss), uR"(<>&'")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:18})", value, ss), uR"('"<>&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:19})", value, ss), uR"(<"&'>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:20})", value, ss), uR"(<<<<<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:21})", value, ss), uR"(>>>>>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:22})", value, ss), uR"(&&&&&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:23})", value, ss), uR"(""""")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:24})", value, ss), uR"(''''')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:25})", value, ss), uR"(A<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:26})", value, ss), uR"(A>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:27})", value, ss), uR"(A&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:28})", value, ss), uR"(A")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:29})", value, ss), uR"(A')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:30})", value, ss), uR"(<A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:31})", value, ss), uR"(>A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:32})", value, ss), uR"(&A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:33})", value, ss), uR"("A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:34})", value, ss), uR"('A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:35})", value, ss), uR"(A<A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:36})", value, ss), uR"(A>A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:37})", value, ss), uR"(A&A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:38})", value, ss), uR"(A"A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:39})", value, ss), uR"(A'A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:40})", value, ss), uR"(AA<AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:41})", value, ss), uR"(AA>AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:42})", value, ss), uR"(AA&AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:43})", value, ss), uR"(AA"AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:44})", value, ss), uR"(AA'AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:45})", value, ss), uR"(AA<<<<AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:46})", value, ss), uR"(AA>>>>AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:47})", value, ss), uR"(AA&&&&AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:48})", value, ss), uR"(AA""""AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:49})", value, ss), uR"(AA''''AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:50})", value, ss), uR"(<A>B'C"D&E'F"G<H>I&G"K)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:51})", value, ss), uR"(AB"CD'EF<GH>IGK')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:52})", value, ss), uR"("ABC'DEF<GHI>GK<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:53})", value, ss), uR"(A""BC<<DE>>FG''HI&&GK)", __LINE__);
    ss.Clear();
}